

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QByteArray,QByteArray>>::emplace<QByteArray_const&,QByteArray>
          (QMovableArrayOps<std::pair<QByteArray,QByteArray>> *this,qsizetype i,QByteArray *args,
          QByteArray *args_1)

{
  long *plVar1;
  int *piVar2;
  Data *pDVar3;
  char *pcVar4;
  Data *pDVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  qsizetype qVar10;
  long lVar11;
  
  piVar2 = *(int **)this;
  if ((piVar2 != (int *)0x0) && (*piVar2 < 2)) {
    lVar11 = *(long *)(this + 0x10);
    if ((lVar11 == i && piVar2 != (int *)0x0) &&
       (*(long *)(piVar2 + 2) - lVar11 !=
        ((long)(*(long *)(this + 8) - ((long)piVar2 + 0x1fU & 0xfffffffffffffff0)) >> 4) *
        -0x5555555555555555)) {
      lVar8 = *(long *)(this + 8);
      lVar11 = lVar11 * 0x30;
      lVar7 = lVar8 + lVar11;
      pDVar3 = (args->d).d;
      *(Data **)(lVar8 + lVar11) = pDVar3;
      *(char **)(lVar8 + 8 + lVar11) = (args->d).ptr;
      *(qsizetype *)(lVar8 + 0x10 + lVar11) = (args->d).size;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar3 = (args_1->d).d;
      (args_1->d).d = (Data *)0x0;
      *(Data **)(lVar7 + 0x18) = pDVar3;
      pcVar4 = (args_1->d).ptr;
      (args_1->d).ptr = (char *)0x0;
      *(char **)(lVar7 + 0x20) = pcVar4;
      qVar10 = (args_1->d).size;
      (args_1->d).size = 0;
      *(qsizetype *)(lVar7 + 0x28) = qVar10;
      goto LAB_001a3649;
    }
    if (((i == 0) && (piVar2 != (int *)0x0)) &&
       (((long)piVar2 + 0x1fU & 0xfffffffffffffff0) != *(ulong *)(this + 8))) {
      lVar11 = *(long *)(this + 8);
      pDVar3 = (args->d).d;
      *(Data **)(lVar11 + -0x30) = pDVar3;
      *(char **)(lVar11 + -0x28) = (args->d).ptr;
      *(qsizetype *)(lVar11 + -0x20) = (args->d).size;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar3 = (args_1->d).d;
      (args_1->d).d = (Data *)0x0;
      *(Data **)(lVar11 + -0x18) = pDVar3;
      pcVar4 = (args_1->d).ptr;
      (args_1->d).ptr = (char *)0x0;
      *(char **)(lVar11 + -0x10) = pcVar4;
      qVar10 = (args_1->d).size;
      (args_1->d).size = 0;
      *(qsizetype *)(lVar11 + -8) = qVar10;
      *(long *)(this + 8) = *(long *)(this + 8) + -0x30;
      goto LAB_001a3649;
    }
  }
  pDVar3 = (args->d).d;
  pcVar4 = (args->d).ptr;
  lVar11 = (args->d).size;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pDVar5 = (args_1->d).d;
  pcVar6 = (args_1->d).ptr;
  (args_1->d).d = (Data *)0x0;
  (args_1->d).ptr = (char *)0x0;
  lVar7 = (args_1->d).size;
  (args_1->d).size = 0;
  lVar8 = *(long *)(this + 0x10);
  QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::detachAndGrow
            ((QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)this,
             (uint)(i == 0 && lVar8 != 0),1,(pair<QByteArray,_QByteArray> **)0x0,
             (QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)0x0);
  lVar9 = *(long *)(this + 8);
  if (i == 0 && lVar8 != 0) {
    *(Data **)(lVar9 + -0x30) = pDVar3;
    *(char **)(lVar9 + -0x28) = pcVar4;
    *(long *)(lVar9 + -0x20) = lVar11;
    *(Data **)(lVar9 + -0x18) = pDVar5;
    *(char **)(lVar9 + -0x10) = pcVar6;
    *(long *)(lVar9 + -8) = lVar7;
    *(long *)(this + 8) = lVar9 + -0x30;
  }
  else {
    plVar1 = (long *)(lVar9 + i * 0x30);
    memmove(plVar1 + 6,(void *)(lVar9 + i * 0x30),(*(long *)(this + 0x10) - i) * 0x30);
    *plVar1 = (long)pDVar3;
    plVar1[1] = (long)pcVar4;
    plVar1[2] = lVar11;
    plVar1[3] = (long)pDVar5;
    plVar1[4] = (long)pcVar6;
    plVar1[5] = lVar7;
  }
LAB_001a3649:
  *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }